

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O1

Exception syntaxErrorAnalysis(vector<Token,_std::allocator<Token>_> *input)

{
  TokenType TVar1;
  _Alloc_hider _Var2;
  pointer pcVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  pointer pTVar7;
  _Elt_pointer pTVar8;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  ulong uVar9;
  byte bVar10;
  TokenType *pTVar11;
  uint uVar12;
  ulong uVar13;
  long *plVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  bool bVar18;
  initializer_list<TokenType> __l;
  initializer_list<TokenType> __l_00;
  initializer_list<TokenType> __l_01;
  initializer_list<TokenType> __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  Token token;
  Token prevToken;
  Token nextToken;
  Token tmp;
  stack<Token,_std::deque<Token,_std::allocator<Token>_>_> bracketStack;
  allocator_type local_419;
  uint local_418;
  uint local_414;
  ulong local_410;
  undefined4 local_408;
  byte local_401;
  long **local_400;
  undefined1 local_3f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  long **local_3d0;
  ulong local_3c8;
  ulong local_3c0;
  Token local_3b8;
  Token local_390;
  undefined1 local_368 [8];
  char *pcStack_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  long *local_348 [2];
  long local_338 [2];
  long *local_328 [2];
  long local_318 [2];
  undefined1 *local_308 [2];
  undefined1 local_2f8 [16];
  undefined1 *local_2e8 [2];
  undefined1 local_2d8 [16];
  long *local_2c8 [2];
  long local_2b8 [2];
  long **local_2a8;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200;
  undefined1 local_1e0 [8];
  _Alloc_hider local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  undefined1 local_1b8 [8];
  _Alloc_hider local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  long local_188;
  ulong local_180;
  ulong local_178;
  vector<TokenType,_std::allocator<TokenType>_> local_170;
  vector<TokenType,_std::allocator<TokenType>_> local_158;
  vector<TokenType,_std::allocator<TokenType>_> local_140;
  vector<TokenType,_std::allocator<TokenType>_> local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  _Deque_base<Token,_std::allocator<Token>_> local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  vector<Token,_std::allocator<Token>_> local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<Token,_std::allocator<Token>_> local_48;
  
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<Token,_std::allocator<Token>_>::_M_initialize_map(&local_f8,0);
  local_410 = ((long)(input->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(input->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  iVar15 = (int)local_410;
  bVar10 = 1 < iVar15;
  if (iVar15 < 2) {
    uVar16 = 1;
  }
  else {
    local_178 = (ulong)(iVar15 - 1U);
    local_190 = &local_2a0.field_2;
    local_3d0 = local_348;
    local_188 = (long)(iVar15 + -2);
    local_400 = local_348;
    local_410 = (ulong)(int)(iVar15 - 1U);
    uVar13 = 0;
    local_3c0 = 0;
    local_3c8 = 0;
    local_2a8 = local_3d0;
    local_180 = local_410;
    do {
      local_401 = bVar10;
      local_3f0._M_dataplus._M_p = local_3f8 + 0x18;
      if (uVar13 == 0) {
        iVar15 = 1;
      }
      else {
        pTVar7 = (input->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar15 = 1;
        uVar9 = uVar13;
        do {
          iVar15 = iVar15 + (uint)(pTVar7->type == EOL);
          pTVar7 = pTVar7 + 1;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      pTVar7 = (input->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar16 = iVar15 - (uint)(pTVar7[uVar13].type == EOfF);
      local_3f8._0_4_ = pTVar7[uVar13].type;
      _Var2._M_p = pTVar7[uVar13].source._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_3f8 + 8),_Var2._M_p,
                 _Var2._M_p + pTVar7[uVar13].source._M_string_length);
      std::vector<Token,_std::allocator<Token>_>::vector(&local_90,input);
      iVar15 = (int)uVar13;
      prev(&local_3b8,&local_90,iVar15);
      std::vector<Token,_std::allocator<Token>_>::~vector(&local_90);
      std::vector<Token,_std::allocator<Token>_>::vector(&local_48,input);
      next(&local_390,&local_48,iVar15);
      std::vector<Token,_std::allocator<Token>_>::~vector(&local_48);
      if (local_3f8._0_4_ == EOL) {
        if (((local_3c0 & 1) == 0) && ((local_3c8 & 1) == 0)) goto LAB_0010c8e5;
        local_414 = 1;
LAB_0010c681:
        local_418 = 0x21;
        goto LAB_0010c689;
      }
      iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_3f8 + 8),"\"");
      if ((iVar6 == 0) && ((local_3c8 & 1) == 0)) {
        local_3c0 = local_3c0 ^ 1;
LAB_0010c8e5:
        local_414 = 4;
      }
      else {
        iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_3f8 + 8),"\'");
        if ((iVar6 == 0) && ((local_3c0 & 1) == 0)) {
          local_3c8 = local_3c8 ^ 1;
          goto LAB_0010c8e5;
        }
        bVar5 = Token::isLeftBracket((Token *)local_3f8);
        if ((bVar5) ||
           (bVar5 = Token::isRightBracket((Token *)local_3f8), uVar4 = local_3f8._0_4_, bVar5)) {
          bVar5 = Token::isLeftBracket((Token *)local_3f8);
          if (!bVar5) {
            if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_f8._M_impl.super__Deque_impl_data._M_start._M_cur) {
              local_414 = 1;
            }
            else {
              pTVar8 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_f8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                pTVar8 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
              }
              local_368._0_4_ = pTVar8[-1].type;
              pcStack_360 = local_358._M_local_buf + 8;
              pcVar3 = pTVar8[-1].source._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&pcStack_360,pcVar3,pcVar3 + pTVar8[-1].source._M_string_length);
              std::deque<Token,_std::allocator<Token>_>::pop_back
                        ((deque<Token,_std::allocator<Token>_> *)&local_f8);
              local_1b8._0_4_ = local_368._0_4_;
              local_1b0._M_p = (pointer)&local_1a0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1b0,pcStack_360,
                         pcStack_360 +
                         CONCAT44(local_358._M_allocated_capacity._4_4_,
                                  local_358._M_allocated_capacity._0_4_));
              local_1e0._0_4_ = local_3f8._0_4_;
              local_1d8._M_p = (pointer)&local_1c8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1d8,local_3f0._M_dataplus._M_p,
                         local_3f0._M_dataplus._M_p + local_3f0._M_string_length);
              bVar5 = isBracketPair((Token *)local_1b8,(Token *)local_1e0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._M_p != &local_1c8) {
                operator_delete(local_1d8._M_p,local_1c8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b0._M_p != &local_1a0) {
                operator_delete(local_1b0._M_p,local_1a0._M_allocated_capacity + 1);
              }
              if (bVar5) {
                if (pcStack_360 != local_358._M_local_buf + 8) {
                  operator_delete(pcStack_360,local_358._8_8_ + 1);
                }
                goto LAB_0010c8e5;
              }
              local_414 = 1;
              if (pcStack_360 != local_358._M_local_buf + 8) {
                operator_delete(pcStack_360,local_358._8_8_ + 1);
              }
            }
            local_418 = 0x20;
            goto LAB_0010c689;
          }
          local_414 = 4;
          std::deque<Token,_std::allocator<Token>_>::push_back
                    ((deque<Token,_std::allocator<Token>_> *)&local_f8,(value_type *)local_3f8);
        }
        else {
          local_414 = 1;
          if ((local_3f8._0_4_ == CharLiteral) && (local_3f0._M_string_length != 3)) {
            local_418 = 0x1c;
          }
          else {
            if (local_3f8._0_4_ == Name) {
              local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2a0,local_3f0._M_dataplus._M_p,
                         local_3f0._M_dataplus._M_p + local_3f0._M_string_length);
              bVar5 = isCorrectName(&local_2a0);
              if (bVar5) goto LAB_0010c9cf;
              local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_200,local_3f0._M_dataplus._M_p,
                         local_3f0._M_dataplus._M_p + local_3f0._M_string_length);
              bVar18 = canBeDivided(&local_200);
              bVar18 = !bVar18;
              bVar5 = true;
            }
            else {
LAB_0010c9cf:
              bVar5 = false;
              bVar18 = false;
            }
            if ((bVar5) &&
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_200._M_dataplus._M_p != &local_200.field_2)) {
              operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1
                             );
            }
            if ((uVar4 == Name) &&
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a0._M_dataplus._M_p != &local_2a0.field_2)) {
              operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1
                             );
            }
            if (bVar18) {
              if ((*local_3f0._M_dataplus._M_p == '\"') || (*local_3f0._M_dataplus._M_p == '\''))
              goto LAB_0010c681;
              local_418 = 0x1f;
            }
            else {
              iVar6 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_3f8 + 8),".");
              if (iVar6 == 0) {
                iVar6 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (&local_3b8.source,".");
                if ((iVar6 == 0) ||
                   (iVar6 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            compare(&local_390.source,"."), iVar6 == 0)) goto LAB_0010c8e5;
                if ((local_3b8.type == IntNumber) || (local_390.type != IntNumber)) {
                  iVar6 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(local_3f8 + 8),".");
                  if ((iVar15 != 0 || iVar6 != 0) &&
                     ((((((local_3b8.type != Keyword &&
                          (bVar5 = Token::isOperator(&local_3b8),
                          !bVar5 && local_3b8.type != Constant)) && (local_390.type != Keyword)) &&
                        (bVar5 = Token::isOperator(&local_390), !bVar5 && local_390.type != Constant
                        )) || (iVar15 = std::__cxx11::
                                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        ::compare(&local_3b8.source,"this"), iVar15 == 0)) &&
                      ((bVar5 = Token::isRightBracket(&local_3b8),
                       bVar5 || local_3b8.type != Punctuation &&
                       (bVar5 = Token::isLeftBracket(&local_390),
                       bVar5 || local_390.type != Punctuation)))))) goto LAB_0010cae2;
                  local_418 = 0x1b;
                }
                else {
                  local_418 = 0x19;
                }
              }
              else {
LAB_0010cae2:
                if ((((uVar13 < 2) || (local_3f8._0_4_ != IntNumber)) ||
                    ((local_188 <= (long)uVar13 ||
                     (((pTVar7 = (input->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                                 super__Vector_impl_data._M_start,
                       pTVar7[uVar13 - 2].type != IntNumber ||
                       (iVar15 = std::__cxx11::
                                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                 compare(&pTVar7[uVar13 - 1].source,"."), iVar15 != 0)) ||
                      (iVar15 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                compare(&(input->super__Vector_base<Token,_std::allocator<Token>_>).
                                         _M_impl.super__Vector_impl_data._M_start[uVar13 + 1].source
                                        ,"."), iVar15 != 0)))))) ||
                   ((input->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar13 + 2].type != IntNumber)) {
                  iVar15 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_3f8 + 8),",");
                  if (iVar15 == 0) {
                    if (((uVar13 != 0) &&
                        (bVar5 = Token::isRightBracket(&local_3b8),
                        bVar5 || local_3b8.type != Punctuation)) &&
                       (bVar5 = Token::isLeftBracket(&local_390),
                       bVar5 || local_390.type != Punctuation)) {
                      local_368 = (undefined1  [8])&local_358;
                      std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"+","");
                      local_348[0] = local_338;
                      std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"-","");
                      __l_03._M_len = 2;
                      __l_03._M_array = (iterator)local_368;
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::vector(&local_60,__l_03,(allocator_type *)&local_419);
                      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_220,local_3b8.source._M_dataplus._M_p,
                                 local_3b8.source._M_dataplus._M_p +
                                 local_3b8.source._M_string_length);
                      bVar5 = contain<std::__cxx11::string>(&local_60,&local_220);
                      if (bVar5) {
                        local_408 = 0;
                      }
                      else {
                        bVar5 = Token::isOperator(&local_3b8);
                        local_408 = (undefined4)CONCAT71(extraout_var,bVar5);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_220._M_dataplus._M_p != &local_220.field_2) {
                        operator_delete(local_220._M_dataplus._M_p,
                                        local_220.field_2._M_allocated_capacity + 1);
                      }
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector(&local_60);
                      lVar17 = -0x40;
                      plVar14 = local_338;
                      do {
                        if (plVar14 != (long *)plVar14[-2]) {
                          operator_delete((long *)plVar14[-2],*plVar14 + 1);
                        }
                        plVar14 = plVar14 + -4;
                        lVar17 = lVar17 + 0x20;
                      } while (lVar17 != 0);
                      if ((char)local_408 == '\0') {
                        local_368 = (undefined1  [8])&local_358;
                        std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"+","");
                        local_348[0] = local_338;
                        std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"-","");
                        local_328[0] = local_318;
                        std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"!","");
                        __l_04._M_len = 3;
                        __l_04._M_array = (iterator)local_368;
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::vector(&local_78,__l_04,(allocator_type *)&local_419);
                        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_240,local_390.source._M_dataplus._M_p,
                                   local_390.source._M_dataplus._M_p +
                                   local_390.source._M_string_length);
                        bVar5 = contain<std::__cxx11::string>(&local_78,&local_240);
                        if (bVar5) {
                          local_408 = 0;
                        }
                        else {
                          bVar5 = Token::isOperator(&local_390);
                          local_408 = (undefined4)CONCAT71(extraout_var_00,bVar5);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_240._M_dataplus._M_p != &local_240.field_2) {
                          operator_delete(local_240._M_dataplus._M_p,
                                          local_240.field_2._M_allocated_capacity + 1);
                        }
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~vector(&local_78);
                        lVar17 = -0x60;
                        plVar14 = local_318;
                        do {
                          if (plVar14 != (long *)plVar14[-2]) {
                            operator_delete((long *)plVar14[-2],*plVar14 + 1);
                          }
                          plVar14 = plVar14 + -4;
                          lVar17 = lVar17 + 0x20;
                        } while (lVar17 != 0);
                        if ((char)local_408 == '\0') {
                          local_368 = (undefined1  [8])&local_358;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_368,"this","");
                          __l_05._M_len = 1;
                          __l_05._M_array = (iterator)local_368;
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::vector(&local_110,__l_05,(allocator_type *)&local_419);
                          local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_260,local_3b8.source._M_dataplus._M_p,
                                     local_3b8.source._M_dataplus._M_p +
                                     local_3b8.source._M_string_length);
                          bVar5 = contain<std::__cxx11::string>(&local_110,&local_260);
                          bVar18 = local_3b8.type != Keyword;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_260._M_dataplus._M_p != &local_260.field_2) {
                            operator_delete(local_260._M_dataplus._M_p,
                                            local_260.field_2._M_allocated_capacity + 1);
                          }
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~vector(&local_110);
                          if (local_368 != (undefined1  [8])&local_358) {
                            operator_delete((void *)local_368,
                                            CONCAT44(local_358._M_allocated_capacity._4_4_,
                                                     local_358._M_allocated_capacity._0_4_) + 1);
                          }
                          if (bVar5 || bVar18) {
                            local_368 = (undefined1  [8])&local_358;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_368,"this","");
                            local_348[0] = local_338;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_348,"not","");
                            local_328[0] = local_318;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_328,"lambda","");
                            local_308[0] = local_2f8;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_308,"new","");
                            local_2e8[0] = local_2d8;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_2e8,"ref","");
                            local_2c8[0] = local_2b8;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_2c8,"out","");
                            __l_06._M_len = 6;
                            __l_06._M_array = (iterator)local_368;
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::vector(&local_a8,__l_06,(allocator_type *)&local_419);
                            local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
                            std::__cxx11::string::_M_construct<char*>
                                      ((string *)&local_280,local_390.source._M_dataplus._M_p,
                                       local_390.source._M_dataplus._M_p +
                                       local_390.source._M_string_length);
                            bVar5 = contain<std::__cxx11::string>(&local_a8,&local_280);
                            bVar18 = local_390.type != Keyword;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_280._M_dataplus._M_p != &local_280.field_2) {
                              operator_delete(local_280._M_dataplus._M_p,
                                              local_280.field_2._M_allocated_capacity + 1);
                            }
                            local_408 = CONCAT31(local_408._1_3_,bVar5 || bVar18);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~vector(&local_a8);
                            lVar17 = -0xc0;
                            plVar14 = local_2b8;
                            do {
                              if (plVar14 != (long *)plVar14[-2]) {
                                operator_delete((long *)plVar14[-2],*plVar14 + 1);
                              }
                              plVar14 = plVar14 + -4;
                              lVar17 = lVar17 + 0x20;
                            } while (lVar17 != 0);
                            if ((char)local_408 != '\0') goto LAB_0010cb61;
                          }
                        }
                      }
                    }
                    local_418 = 0x2a;
                  }
                  else {
LAB_0010cb61:
                    if (local_3f8._0_4_ == Name) {
                      if (uVar13 == 0) {
LAB_0010cc0c:
                        local_368 = (undefined1  [8])0x700000003;
                        pcStack_360 = (char *)0x90000000a;
                        local_358._M_allocated_capacity._0_4_ = 5;
                        __l_00._M_len = 5;
                        __l_00._M_array = (iterator)local_368;
                        std::vector<TokenType,_std::allocator<TokenType>_>::vector
                                  (&local_140,__l_00,&local_419);
                        bVar5 = local_140.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                                _M_impl.super__Vector_impl_data._M_start !=
                                local_140.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                                _M_impl.super__Vector_impl_data._M_finish;
                        if (bVar5) {
                          TVar1 = *local_140.
                                   super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl
                                   .super__Vector_impl_data._M_start;
                          pTVar11 = local_140.
                                    super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                                    _M_impl.super__Vector_impl_data._M_start;
                          while (TVar1 != (input->super__Vector_base<Token,_std::allocator<Token>_>)
                                          ._M_impl.super__Vector_impl_data._M_start[uVar13 + 1].type
                                ) {
                            pTVar11 = pTVar11 + 1;
                            bVar5 = pTVar11 !=
                                    local_140.
                                    super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                                    _M_impl.super__Vector_impl_data._M_finish;
                            if (pTVar11 ==
                                local_140.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                                _M_impl.super__Vector_impl_data._M_finish) break;
                            TVar1 = *pTVar11;
                          }
                        }
                        if (local_140.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                            _M_impl.super__Vector_impl_data._M_start != (TokenType *)0x0) {
                          operator_delete(local_140.
                                          super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                                          _M_impl.super__Vector_impl_data._M_start,
                                          (long)local_140.
                                                super__Vector_base<TokenType,_std::allocator<TokenType>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_140.
                                                super__Vector_base<TokenType,_std::allocator<TokenType>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        if (!bVar5) goto LAB_0010cc9b;
                      }
                      else {
                        local_368 = (undefined1  [8])0x700000003;
                        pcStack_360 = (char *)0x90000000a;
                        local_358._M_allocated_capacity._0_4_ = 5;
                        __l._M_len = 5;
                        __l._M_array = (iterator)local_368;
                        std::vector<TokenType,_std::allocator<TokenType>_>::vector
                                  (&local_128,__l,&local_419);
                        bVar5 = local_128.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                                _M_impl.super__Vector_impl_data._M_start !=
                                local_128.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                                _M_impl.super__Vector_impl_data._M_finish;
                        if (bVar5) {
                          TVar1 = *local_128.
                                   super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl
                                   .super__Vector_impl_data._M_start;
                          pTVar11 = local_128.
                                    super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                                    _M_impl.super__Vector_impl_data._M_start;
                          while (TVar1 != (input->super__Vector_base<Token,_std::allocator<Token>_>)
                                          ._M_impl.super__Vector_impl_data._M_start[uVar13 - 1].type
                                ) {
                            pTVar11 = pTVar11 + 1;
                            bVar5 = pTVar11 !=
                                    local_128.
                                    super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                                    _M_impl.super__Vector_impl_data._M_finish;
                            if (pTVar11 ==
                                local_128.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                                _M_impl.super__Vector_impl_data._M_finish) break;
                            TVar1 = *pTVar11;
                          }
                        }
                        if (local_128.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                            _M_impl.super__Vector_impl_data._M_start != (TokenType *)0x0) {
                          operator_delete(local_128.
                                          super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                                          _M_impl.super__Vector_impl_data._M_start,
                                          (long)local_128.
                                                super__Vector_base<TokenType,_std::allocator<TokenType>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_128.
                                                super__Vector_base<TokenType,_std::allocator<TokenType>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        if (!bVar5) goto LAB_0010cc0c;
                      }
                    }
                    else {
LAB_0010cc9b:
                      if (local_3f8._0_4_ == IntNumber) {
                        if (uVar13 != 0) {
                          local_368 = (undefined1  [8])0xa00000007;
                          pcStack_360 = (char *)0x500000009;
                          __l_01._M_len = 4;
                          __l_01._M_array = (iterator)local_368;
                          std::vector<TokenType,_std::allocator<TokenType>_>::vector
                                    (&local_158,__l_01,&local_419);
                          bVar5 = local_158.
                                  super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
                                  super__Vector_impl_data._M_start !=
                                  local_158.
                                  super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
                                  super__Vector_impl_data._M_finish;
                          if (bVar5) {
                            TVar1 = *local_158.
                                     super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                                     _M_impl.super__Vector_impl_data._M_start;
                            pTVar11 = local_158.
                                      super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                                      _M_impl.super__Vector_impl_data._M_start;
                            while (TVar1 != (input->
                                            super__Vector_base<Token,_std::allocator<Token>_>).
                                            _M_impl.super__Vector_impl_data._M_start[uVar13 - 1].
                                            type) {
                              pTVar11 = pTVar11 + 1;
                              bVar5 = pTVar11 !=
                                      local_158.
                                      super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                                      _M_impl.super__Vector_impl_data._M_finish;
                              if (pTVar11 ==
                                  local_158.
                                  super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
                                  super__Vector_impl_data._M_finish) break;
                              TVar1 = *pTVar11;
                            }
                          }
                          if (local_158.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                              _M_impl.super__Vector_impl_data._M_start != (TokenType *)0x0) {
                            operator_delete(local_158.
                                            super__Vector_base<TokenType,_std::allocator<TokenType>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_158.
                                                  super__Vector_base<TokenType,_std::allocator<TokenType>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_158.
                                                                                                        
                                                  super__Vector_base<TokenType,_std::allocator<TokenType>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if (bVar5) goto LAB_0010cfc8;
                        }
                        local_368 = (undefined1  [8])0xa00000007;
                        pcStack_360 = (char *)0x500000009;
                        __l_02._M_len = 4;
                        __l_02._M_array = (iterator)local_368;
                        std::vector<TokenType,_std::allocator<TokenType>_>::vector
                                  (&local_170,__l_02,&local_419);
                        bVar5 = local_170.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                                _M_impl.super__Vector_impl_data._M_start !=
                                local_170.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                                _M_impl.super__Vector_impl_data._M_finish;
                        if (bVar5) {
                          TVar1 = *local_170.
                                   super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl
                                   .super__Vector_impl_data._M_start;
                          pTVar11 = local_170.
                                    super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                                    _M_impl.super__Vector_impl_data._M_start;
                          while (TVar1 != (input->super__Vector_base<Token,_std::allocator<Token>_>)
                                          ._M_impl.super__Vector_impl_data._M_start[uVar13 + 1].type
                                ) {
                            pTVar11 = pTVar11 + 1;
                            bVar5 = pTVar11 !=
                                    local_170.
                                    super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                                    _M_impl.super__Vector_impl_data._M_finish;
                            if (pTVar11 ==
                                local_170.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                                _M_impl.super__Vector_impl_data._M_finish) break;
                            TVar1 = *pTVar11;
                          }
                        }
                        if (local_170.super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                            _M_impl.super__Vector_impl_data._M_start != (TokenType *)0x0) {
                          operator_delete(local_170.
                                          super__Vector_base<TokenType,_std::allocator<TokenType>_>.
                                          _M_impl.super__Vector_impl_data._M_start,
                                          (long)local_170.
                                                super__Vector_base<TokenType,_std::allocator<TokenType>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_170.
                                                super__Vector_base<TokenType,_std::allocator<TokenType>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        if (bVar5) goto LAB_0010cfc8;
                      }
                      iVar15 = std::__cxx11::
                               basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                               compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(local_3f8 + 8),":");
                      if ((iVar15 != 0) ||
                         ((uVar13 != 0 &&
                          (((local_3b8.type == Name && (local_390.type == Name)) ||
                           ((iVar15 = std::__cxx11::
                                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      ::compare(&local_3b8.source,")"), iVar15 == 0 ||
                            (iVar15 = std::__cxx11::
                                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      ::compare(&local_390.source,"="), iVar15 == 0)))))))) {
                        local_414 = 0;
                        goto LAB_0010c8ed;
                      }
                    }
LAB_0010cfc8:
                    local_418 = 0x1a;
                  }
                }
                else {
                  local_418 = 0x18;
                }
              }
            }
          }
LAB_0010c689:
          local_410 = (ulong)uVar16;
        }
      }
LAB_0010c8ed:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390.source._M_dataplus._M_p != &local_390.source.field_2) {
        operator_delete(local_390.source._M_dataplus._M_p,
                        local_390.source.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8.source._M_dataplus._M_p != &local_3b8.source.field_2) {
        operator_delete(local_3b8.source._M_dataplus._M_p,
                        local_3b8.source.field_2._M_allocated_capacity + 1);
      }
      if (local_3f0._M_dataplus._M_p != local_3f8 + 0x18) {
        operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
      }
      bVar10 = local_401;
      if ((local_414 & 3) != 0) break;
      uVar13 = uVar13 + 1;
      bVar10 = (long)uVar13 < (long)local_180;
    } while (uVar13 != local_178);
  }
  uVar13 = local_410;
  uVar12 = local_418;
  if ((bVar10 & 1) == 0) {
    uVar12 = 0x20;
    if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_f8._M_impl.super__Deque_impl_data._M_start._M_cur) {
      uVar12 = 0x2b;
      uVar16 = 0xffffffff;
    }
    uVar13 = (ulong)uVar16;
  }
  std::deque<Token,_std::allocator<Token>_>::~deque
            ((deque<Token,_std::allocator<Token>_> *)&local_f8);
  return (Exception)((ulong)uVar12 | uVar13 << 0x20);
}

Assistant:

Exception syntaxErrorAnalysis(vector<Token> input) {
	int lineIndex = 1;
	stack<Token> bracketStack;
	bool isString = false, isChar = false;
	// длина входного потока
	int end = input.size();
	// последний символ - EOfF, поэтому читаем до предпоследнего
	for (int i = 0; i < end - 1; ++i) {
		lineIndex = getLineIndex(input, i);
		Token token = input[i];
		Token prevToken = prev(input, i), nextToken = next(input, i);

		if (token.isEndOfLine()) {
			if (isString or isChar) {
				return Exception(QuotesSequenceError, lineIndex);
			}
			continue;
		}
		// обработка строк
		if (token.source == "\"" and not isChar) {
			isString = not isString;
			continue;
		}
		if (token.source == "\'" and not isString) {
			isChar = not isChar;
			continue;
		}
		// обработка скобочных последовательностей
		if (token.isBracket()) {
			if (token.isLeftBracket()) {
				bracketStack.push(token);
			} else {
				if (bracketStack.empty()) {
					return Exception(BracketSequenceError, lineIndex);
				} else {
					Token tmp = bracketStack.top();
					bracketStack.pop();
					if (not isBracketPair(tmp, token))
						return Exception(BracketSequenceError, lineIndex);
				}
			}
			continue;
		}
		// обработка CharFormatError
		if (token.type == CharLiteral and token.source.size() != 3) {
			return Exception(CharFormatError, lineIndex);
		}
		// обработка неправильных имен
		if (token.type == Name and not isCorrectName(token.source) and not canBeDivided(token.source)) {
			if (token.source[0] == '\"' or token.source[0] == '\'') {
				return Exception(QuotesSequenceError, lineIndex);
			}
			return Exception(NameError, lineIndex);
		}
		// MemberError для Int после Name
		// а также UnexpectedDotError - один из операндов точки ключевое слово или оператор и тд
		if (token.source == ".") {
			if (prevToken.source == "." or nextToken.source == ".") continue;
			if (prevToken.type != IntNumber and nextToken.type == IntNumber) {
				return Exception(MemberError, lineIndex);
			}
			if (token.source == "." and i == 0) {
				return Exception(UnexpectedDotError, lineIndex);
			}
			if (prevToken.type == Keyword or prevToken.isOperator() or prevToken.type == Constant or
			    nextToken.type == Keyword or nextToken.isOperator() or nextToken.type == Constant) {
				if (prevToken.source != "this")
					return Exception(UnexpectedDotError, lineIndex);
			}
			if (not prevToken.isRightBracket() and prevToken.type == Punctuation) {
				return Exception(UnexpectedDotError, lineIndex);
			}
			if (not nextToken.isLeftBracket() and nextToken.type == Punctuation) {
				return Exception(UnexpectedDotError, lineIndex);
			}
		}
		// обработка неправильного использования оператора .  - TooManyPointsInNumber
		if (token.type == IntNumber and i > 1 and i < end - 2) {
			if (input[i - 2].type == IntNumber and input[i - 1].source == "." and
			    input[i + 1].source == "." and input[i + 2].type == IntNumber) {
				return Exception(TooManyPointsInNumber, lineIndex);
			}
		}
		// обработка UnexpectedTokenError
		if (token.source == ",") {
			if (i == 0) return Exception(UnexpectedTokenError, lineIndex);

			if (not prevToken.isRightBracket() and prevToken.type == Punctuation) {
				return Exception(UnexpectedTokenError, lineIndex);
			}
			if (not nextToken.isLeftBracket() and nextToken.type == Punctuation) {
				return Exception(UnexpectedTokenError, lineIndex);
			}

			if (not contain({"+", "-"}, prevToken.source) and prevToken.isOperator()) {
				return Exception(UnexpectedTokenError, lineIndex);
			}
			if (not contain({"+", "-", "!"}, nextToken.source) and nextToken.isOperator()) {
				return Exception(UnexpectedTokenError, lineIndex);
			}

			if (not contain({"this"}, prevToken.source) and prevToken.type == Keyword) {
				return Exception(UnexpectedTokenError, lineIndex);
			}
			if (not contain({"this", "not", "lambda", "new", "ref", "out"}, nextToken.source) and
			    nextToken.type == Keyword) {
				return Exception(UnexpectedTokenError, lineIndex);
			}
		}

		// SyntaxError
		if (token.type == Name) {
			if (i != 0) {
				if (contain({Name, IntNumber, CharLiteral, StringLiteral, Constant}, input[i - 1].type))
					return Exception(SyntaxError, lineIndex);
			}
			if (contain({Name, IntNumber, CharLiteral, StringLiteral, Constant}, input[i + 1].type)) {
				return Exception(SyntaxError, lineIndex);
			}
		}

		// TODO: возможны ошибки с Keyword
		if (token.type == IntNumber) {
			if (i != 0) {
				if (contain({IntNumber, CharLiteral, StringLiteral, Constant}, input[i - 1].type)) {
					return Exception(SyntaxError, lineIndex);
				}
//				if (input[i - 1].type == Keyword and input[i - 1].source != "else") {
//					return Exception(SyntaxError, lineIndex);
//				}
			}
			if (contain({IntNumber, CharLiteral, StringLiteral, Constant}, input[i + 1].type)) {
				return Exception(SyntaxError, lineIndex);
			}
		}

		if (token.source == ":") {
			if (i == 0) return Exception(SyntaxError, lineIndex);
			if ((prevToken.type != Name or nextToken.type != Name) and prevToken.source != ")" and
			    nextToken.source != "=") {
				return Exception(SyntaxError, lineIndex);
			}
		}
	}
	if (not bracketStack.empty()) return Exception(BracketSequenceError, lineIndex);
	return Exception(Nothing);
}